

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

void sysbvm_primitiveTable_registerFunction
               (sysbvm_functionEntryPoint_t primitiveEntryPoint,char *primitiveName)

{
  ulong uVar1;
  ulong uVar2;
  sysbvm_primitiveTableEntry_t *psVar3;
  bool bVar4;
  
  uVar1 = (ulong)sysbvm_primitiveTableSize;
  bVar4 = uVar1 != 0;
  if (bVar4) {
    if (sysbvm_primitiveTable[0].entryPoint != primitiveEntryPoint) {
      psVar3 = sysbvm_primitiveTable;
      uVar2 = 0;
      do {
        psVar3 = psVar3 + 1;
        if (uVar1 - 1 == uVar2) goto LAB_00111a04;
        uVar2 = uVar2 + 1;
      } while (psVar3->entryPoint != primitiveEntryPoint);
      bVar4 = uVar2 < uVar1;
    }
    if (bVar4) {
      return;
    }
  }
LAB_00111a04:
  if (0x3ff < sysbvm_primitiveTableSize) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:42: assertion failure: sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY"
              );
  }
  sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
  sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
  sysbvm_primitiveTableSize = sysbvm_primitiveTableSize + 1;
  return;
}

Assistant:

void sysbvm_primitiveTable_registerFunction(sysbvm_functionEntryPoint_t primitiveEntryPoint, const char *primitiveName)
{
    for(size_t i = 0; i < sysbvm_primitiveTableSize; ++i)
    {
        if(sysbvm_primitiveTable[i].entryPoint == primitiveEntryPoint)
            return;
    }

    SYSBVM_ASSERT(sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY);
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
    ++sysbvm_primitiveTableSize;
}